

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

void init_destination(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long in_RDI;
  my_dest_ptr dest;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x28);
  uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x1000);
  puVar1[6] = uVar2;
  *puVar1 = puVar1[6];
  puVar1[1] = 0x1000;
  return;
}

Assistant:

METHODDEF(void)
init_destination(j_compress_ptr cinfo)
{
  my_dest_ptr dest = (my_dest_ptr)cinfo->dest;

  /* Allocate the output buffer --- it will be released when done with image */
  dest->buffer = (JOCTET *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                OUTPUT_BUF_SIZE * sizeof(JOCTET));

  dest->pub.next_output_byte = dest->buffer;
  dest->pub.free_in_buffer = OUTPUT_BUF_SIZE;
}